

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphviewer.cpp
# Opt level: O3

bool __thiscall GraphViewer::rearrange(GraphViewer *this)

{
  Connection *this_00;
  bool bVar1;
  string local_38;
  
  this_00 = this->con;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"rearrange\n","");
  bVar1 = Connection::sendMsg(this_00,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool GraphViewer::rearrange() {
	return con->sendMsg("rearrange\n");
}